

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O2

pair<unsigned_long,_bool> __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashMapPolicy<unsigned_long,_phmap::flat_hash_set<unsigned_long,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<unsigned_long>_>_>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_phmap::flat_hash_set<unsigned_long,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>
::find_or_prepare_insert<unsigned_long>
          (raw_hash_set<phmap::priv::FlatHashMapPolicy<unsigned_long,_phmap::flat_hash_set<unsigned_long,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<unsigned_long>_>_>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_phmap::flat_hash_set<unsigned_long,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>
           *this,unsigned_long *key,size_t hashval)

{
  char *pcVar1;
  uint uVar2;
  char cVar3;
  uint uVar4;
  ulong uVar5;
  undefined8 extraout_RDX;
  undefined8 uVar6;
  long lVar7;
  __m128i match;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar11 [16];
  pair<unsigned_long,_bool> pVar15;
  probe_seq<16UL> seq;
  probe_seq<16UL> local_38;
  char cVar10;
  char cVar12;
  char cVar13;
  char cVar14;
  
  probe(&local_38,this,hashval);
  auVar8 = ZEXT216(CONCAT11((char)hashval,(char)hashval) & 0x7f7f);
  auVar8 = pshuflw(auVar8,auVar8,0);
  do {
    pcVar1 = this->ctrl_ + local_38.offset_;
    cVar3 = pcVar1[0xf];
    cVar10 = auVar8[0];
    auVar11[0] = -(cVar10 == *pcVar1);
    cVar12 = auVar8[1];
    auVar11[1] = -(cVar12 == pcVar1[1]);
    cVar13 = auVar8[2];
    auVar11[2] = -(cVar13 == pcVar1[2]);
    cVar14 = auVar8[3];
    auVar11[3] = -(cVar14 == pcVar1[3]);
    auVar11[4] = -(cVar10 == pcVar1[4]);
    auVar11[5] = -(cVar12 == pcVar1[5]);
    auVar11[6] = -(cVar13 == pcVar1[6]);
    auVar11[7] = -(cVar14 == pcVar1[7]);
    auVar11[8] = -(cVar10 == pcVar1[8]);
    auVar11[9] = -(cVar12 == pcVar1[9]);
    auVar11[10] = -(cVar13 == pcVar1[10]);
    auVar11[0xb] = -(cVar14 == pcVar1[0xb]);
    auVar11[0xc] = -(cVar10 == pcVar1[0xc]);
    auVar11[0xd] = -(cVar12 == pcVar1[0xd]);
    auVar11[0xe] = -(cVar13 == pcVar1[0xe]);
    auVar11[0xf] = -(cVar14 == cVar3);
    for (uVar4 = (uint)(ushort)((ushort)(SUB161(auVar11 >> 7,0) & 1) |
                                (ushort)(SUB161(auVar11 >> 0xf,0) & 1) << 1 |
                                (ushort)(SUB161(auVar11 >> 0x17,0) & 1) << 2 |
                                (ushort)(SUB161(auVar11 >> 0x1f,0) & 1) << 3 |
                                (ushort)(SUB161(auVar11 >> 0x27,0) & 1) << 4 |
                                (ushort)(SUB161(auVar11 >> 0x2f,0) & 1) << 5 |
                                (ushort)(SUB161(auVar11 >> 0x37,0) & 1) << 6 |
                                (ushort)(SUB161(auVar11 >> 0x3f,0) & 1) << 7 |
                                (ushort)(SUB161(auVar11 >> 0x47,0) & 1) << 8 |
                                (ushort)(SUB161(auVar11 >> 0x4f,0) & 1) << 9 |
                                (ushort)(SUB161(auVar11 >> 0x57,0) & 1) << 10 |
                                (ushort)(SUB161(auVar11 >> 0x5f,0) & 1) << 0xb |
                                (ushort)(SUB161(auVar11 >> 0x67,0) & 1) << 0xc |
                                (ushort)(SUB161(auVar11 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar11 >> 0x77,0) & 1) << 0xe |
                               (ushort)(auVar11[0xf] >> 7) << 0xf); uVar4 != 0;
        uVar4 = uVar4 - 1 & uVar4) {
      uVar2 = 0;
      if (uVar4 != 0) {
        for (; (uVar4 >> uVar2 & 1) == 0; uVar2 = uVar2 + 1) {
        }
      }
      uVar5 = uVar2 + local_38.offset_ & local_38.mask_;
      if (this->slots_[uVar5].value.first == *key) {
        uVar6 = 0;
        goto LAB_002bc156;
      }
    }
    auVar9[0] = -(*pcVar1 == -0x80);
    auVar9[1] = -(pcVar1[1] == -0x80);
    auVar9[2] = -(pcVar1[2] == -0x80);
    auVar9[3] = -(pcVar1[3] == -0x80);
    auVar9[4] = -(pcVar1[4] == -0x80);
    auVar9[5] = -(pcVar1[5] == -0x80);
    auVar9[6] = -(pcVar1[6] == -0x80);
    auVar9[7] = -(pcVar1[7] == -0x80);
    auVar9[8] = -(pcVar1[8] == -0x80);
    auVar9[9] = -(pcVar1[9] == -0x80);
    auVar9[10] = -(pcVar1[10] == -0x80);
    auVar9[0xb] = -(pcVar1[0xb] == -0x80);
    auVar9[0xc] = -(pcVar1[0xc] == -0x80);
    auVar9[0xd] = -(pcVar1[0xd] == -0x80);
    auVar9[0xe] = -(pcVar1[0xe] == -0x80);
    auVar9[0xf] = -(cVar3 == -0x80);
    if ((((((((((((((((auVar9 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar9 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar9 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar9 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar9 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar9 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar9 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar9 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar9 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar9 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar9 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           (auVar9 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar9 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
         (auVar9 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar9 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) || cVar3 == -0x80) {
      uVar5 = prepare_insert(this,hashval);
      uVar6 = CONCAT71((int7)((ulong)extraout_RDX >> 8),1);
LAB_002bc156:
      pVar15._8_8_ = uVar6;
      pVar15.first = uVar5;
      return pVar15;
    }
    lVar7 = local_38.offset_ + local_38.index_;
    local_38.index_ = local_38.index_ + 0x10;
    local_38.offset_ = lVar7 + 0x10U & local_38.mask_;
  } while( true );
}

Assistant:

std::pair<size_t, bool> find_or_prepare_insert(const K& key, size_t hashval)
			{
				auto seq = probe(hashval);
				while (true) {
					Group g{ctrl_ + seq.offset()};
					for (uint32_t i : g.Match((h2_t)H2(hashval))) {
						if (PHMAP_PREDICT_TRUE(PolicyTraits::apply(
						                           EqualElement<K> {key, eq_ref()},
						                           PolicyTraits::element(slots_ + seq.offset((size_t)i)))))
							return {seq.offset((size_t)i), false};
					}
					if (PHMAP_PREDICT_TRUE(g.MatchEmpty())) break;
					seq.next();
				}
				return {prepare_insert(hashval), true};
			}